

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 *size_desired)

{
  ImGuiSizeCallback p_Var1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImGuiSizeCallbackData local_30;
  
  if (((GImGui->NextWindowData).Flags & 0x10) != 0) {
    fVar6 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
    fVar4 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
    fVar8 = SUB84(size_desired,0);
    fVar5 = (float)((ulong)size_desired >> 0x20);
    if ((fVar6 < 0.0) || (fVar7 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar7 < 0.0)) {
      local_30.DesiredSize.x = (window->SizeFull).x;
    }
    else {
      if (fVar8 <= fVar7) {
        fVar7 = fVar8;
      }
      local_30.DesiredSize.x =
           (float)(-(uint)(fVar8 < fVar6) & (uint)fVar6 | ~-(uint)(fVar8 < fVar6) & (uint)fVar7);
    }
    if ((fVar4 < 0.0) || (fVar6 = (GImGui->NextWindowData).SizeConstraintRect.Max.y, fVar6 < 0.0)) {
      local_30.DesiredSize.y = (window->SizeFull).y;
    }
    else {
      if (fVar5 <= fVar6) {
        fVar6 = fVar5;
      }
      local_30.DesiredSize.y =
           (float)(-(uint)(fVar5 < fVar4) & (uint)fVar4 | ~-(uint)(fVar5 < fVar4) & (uint)fVar6);
    }
    p_Var1 = (GImGui->NextWindowData).SizeCallback;
    if (p_Var1 != (ImGuiSizeCallback)0x0) {
      local_30.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
      local_30.Pos = window->Pos;
      local_30.CurrentSize = window->SizeFull;
      (*p_Var1)(&local_30);
    }
    size_desired = (ImVec2 *)
                   CONCAT44((float)(int)local_30.DesiredSize.y,(float)(int)local_30.DesiredSize.x);
  }
  if ((window->Flags & 0x5000000U) == 0x1000000) {
    fVar4 = 4.0;
    fVar6 = 4.0;
    if ((window->ChildFlags & 4U) != 0) {
      fVar6 = (GImGui->Style).WindowMinSize.x;
    }
    if ((window->ChildFlags & 8U) == 0) goto LAB_001883d5;
  }
  else {
    if ((window->Flags & 0x40U) != 0) {
      fVar4 = 4.0;
      fVar6 = 4.0;
      goto LAB_001883d5;
    }
    fVar6 = (GImGui->Style).WindowMinSize.x;
  }
  fVar4 = (GImGui->Style).WindowMinSize.y;
LAB_001883d5:
  fVar8 = (GImGui->Style).WindowRounding + -1.0;
  fVar8 = (float)(~-(uint)(fVar8 <= 0.0) & (uint)fVar8) +
          window->TitleBarHeight + window->MenuBarHeight;
  uVar2 = -(uint)(fVar8 <= fVar4);
  fVar4 = (float)(uVar2 & (uint)fVar4 | ~uVar2 & (uint)fVar8);
  fVar8 = (float)((ulong)size_desired >> 0x20);
  uVar2 = -(uint)(fVar6 <= SUB84(size_desired,0));
  uVar3 = -(uint)(fVar4 <= fVar8);
  return (ImVec2)(CONCAT44(~uVar3 & (uint)fVar4,~uVar2 & (uint)fVar6) |
                 CONCAT44((uint)fVar8 & uVar3,(uint)SUB84(size_desired,0) & uVar2));
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, const ImVec2& size_desired)
{
    ImGuiContext& g = *GImGui;
    ImVec2 new_size = size_desired;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // See comments in SetNextWindowSizeConstraints() for details about setting size_min an size_max.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_TRUNC(new_size.x);
        new_size.y = IM_TRUNC(new_size.y);
    }

    // Minimum size
    ImVec2 size_min = CalcWindowMinSize(window);
    return ImMax(new_size, size_min);
}